

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# manifest_file.cpp
# Opt level: O2

bool ApiLayerManifestFile::LocateLibraryRelativeToJson
               (string *json_filename,string *library_path,string *out_combined_path)

{
  bool bVar1;
  string combined_path;
  string file_parent;
  string local_58;
  string local_38;
  
  local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
  local_58._M_string_length = 0;
  local_58.field_2._M_local_buf[0] = '\0';
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  local_38._M_string_length = 0;
  local_38.field_2._M_local_buf[0] = '\0';
  bVar1 = FileSysUtilsGetParentPath(json_filename,&local_38);
  if (bVar1) {
    bVar1 = FileSysUtilsCombinePaths(&local_38,library_path,&local_58);
    if (bVar1) {
      bVar1 = FileSysUtilsPathExists(&local_58);
      if (bVar1) {
        bVar1 = true;
        std::__cxx11::string::_M_assign((string *)out_combined_path);
        goto LAB_00113ddb;
      }
    }
  }
  std::__cxx11::string::_M_assign((string *)out_combined_path);
  bVar1 = false;
LAB_00113ddb:
  std::__cxx11::string::~string((string *)&local_38);
  std::__cxx11::string::~string((string *)&local_58);
  return bVar1;
}

Assistant:

bool ApiLayerManifestFile::LocateLibraryRelativeToJson(
    const std::string &json_filename, const std::string &library_path,
    std::string &out_combined_path) {  // Otherwise, treat the library path as a relative path based on the JSON file.
    std::string combined_path;
    std::string file_parent;
    if (!FileSysUtilsGetParentPath(json_filename, file_parent) ||
        !FileSysUtilsCombinePaths(file_parent, library_path, combined_path) || !FileSysUtilsPathExists(combined_path)) {
        out_combined_path = combined_path;
        return false;
    }
    out_combined_path = combined_path;
    return true;
}